

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void processImage(Mat *inputImg,char imageId)

{
  ostream *poVar1;
  string fileName;
  tuple<bool,_float,_cv::Mat> output2;
  Mat newImg;
  tuple<bool,_float,_cv::Mat> output3;
  tuple<bool,_float,_cv::Mat> output;
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  void *local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  tuple<bool,_float,_cv::Mat> local_1c8;
  Mat local_160 [96];
  tuple<bool,_float,_cv::Mat> local_100;
  tuple<bool,_float,_cv::Mat> local_98;
  _InputArray local_30;
  
  removeNoiseIfPresent(&local_98,inputImg);
  if (local_98.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.super__Tuple_impl<1UL,_float,_cv::Mat>.
      _100_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Noisy: ",7);
    poVar1 = std::ostream::_M_insert<double>
                       ((double)local_98.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                                super__Tuple_impl<1UL,_float,_cv::Mat>.
                                super__Head_base<1UL,_float,_false>._M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"%",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No noise!",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Noise %: ",9);
    poVar1 = std::ostream::_M_insert<double>
                       ((double)local_98.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                                super__Tuple_impl<1UL,_float,_cv::Mat>.
                                super__Head_base<1UL,_float,_false>._M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"%",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  }
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  cv::Mat::Mat(local_160,(Mat *)&local_98);
  removeBlurIfPresent(&local_1c8,local_160);
  if (local_1c8.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.super__Tuple_impl<1UL,_float,_cv::Mat>.
      _100_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Blurry: ",8);
    poVar1 = std::ostream::_M_insert<double>
                       ((double)local_1c8.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                                super__Tuple_impl<1UL,_float,_cv::Mat>.
                                super__Head_base<1UL,_float,_false>._M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"%",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No Blur! ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Blur %: ",8);
    poVar1 = std::ostream::_M_insert<double>
                       ((double)local_1c8.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                                super__Tuple_impl<1UL,_float,_cv::Mat>.
                                super__Head_base<1UL,_float,_false>._M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"%",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  }
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  cv::Mat::operator=(local_160,(Mat *)&local_1c8);
  removeCollapsnessIfPresent(&local_100,local_160);
  if (local_100.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.super__Tuple_impl<1UL,_float,_cv::Mat>.
      _100_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Collapsed: ",0xb);
    poVar1 = std::ostream::_M_insert<double>
                       ((double)local_100.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                                super__Tuple_impl<1UL,_float,_cv::Mat>.
                                super__Head_base<1UL,_float,_false>._M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"%",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"No Collapsness! ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Collapsness %: ",0xf);
    poVar1 = std::ostream::_M_insert<double>
                       ((double)local_100.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                                super__Tuple_impl<1UL,_float,_cv::Mat>.
                                super__Head_base<1UL,_float,_false>._M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"%",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  }
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"fixed","");
  std::__cxx11::string::push_back((char)local_208);
  std::__cxx11::string::append((char *)local_208);
  local_30.sz.width = 0;
  local_30.sz.height = 0;
  local_30.flags = 0x1010000;
  local_1d8 = 0;
  local_1e8 = (void *)0x0;
  uStack_1e0 = 0;
  local_30.obj = &local_100;
  cv::imwrite((string *)local_208,&local_30,(vector *)&local_1e8);
  if (local_1e8 != (void *)0x0) {
    operator_delete(local_1e8);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-----------------------------------------------------------------------------",0x4d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0]);
  }
  cv::Mat::~Mat((Mat *)&local_100);
  cv::Mat::~Mat((Mat *)&local_1c8);
  cv::Mat::~Mat(local_160);
  cv::Mat::~Mat((Mat *)&local_98);
  return;
}

Assistant:

void processImage(Mat const& inputImg, char imageId) {
    tuple<bool,float,Mat> output = removeNoiseIfPresent(inputImg);
    if (get<0>(output)) {
        cout << "Noisy: " << get<1>(output)<<"%"<<endl;
    } else {
        cout<<"No noise!"<< " " << "Noise %: " <<get<1>(output)<<"%"<<endl;
    }

    Mat newImg = get<2>(output);
    tuple<bool,float,Mat> output2= removeBlurIfPresent(newImg);
    if (get<0>(output2)) {
        cout << "Blurry: " << get<1>(output2)<<"%"<<endl;
    } else {
        cout<<"No Blur! "<<"Blur %: "<< get<1>(output2)<<"%"<<endl;
    }

    newImg = get<2>(output2);
    tuple<bool,float,Mat> output3= removeCollapsnessIfPresent(newImg);
    if (get<0>(output3)) {
        cout << "Collapsed: " << get<1>(output3)<<"%"<<endl;
    } else {
        cout<<"No Collapsness! "<<"Collapsness %: "<< get<1>(output3)<<"%"<<endl;
    }
    string fileName = "fixed";
    fileName += imageId;
    fileName += ".jpg";

    imwrite(fileName, get<2>(output3));
    cout << "-----------------------------------------------------------------------------" <<endl;
}